

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsbMan.c
# Opt level: O0

void Rsb_ManFree(Rsb_Man_t *p)

{
  Rsb_Man_t *p_local;
  
  Vec_WrdFree(p->vCexes);
  Vec_IntFree(p->vDecPats);
  Vec_IntFree(p->vFanins);
  Vec_IntFree(p->vFaninsOld);
  Vec_IntFree(p->vTries);
  if (p != (Rsb_Man_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Rsb_ManFree( Rsb_Man_t * p )
{
    Vec_WrdFree( p->vCexes );
    Vec_IntFree( p->vDecPats );
    Vec_IntFree( p->vFanins );
    Vec_IntFree( p->vFaninsOld );
    Vec_IntFree( p->vTries );
    ABC_FREE( p );
}